

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O2

void __thiscall OrgData::GetMusicInfo(OrgData *this,MUSICINFO *mi)

{
  long lVar1;
  
  mi->dot = (this->info).dot;
  mi->line = (this->info).line;
  mi->alloc_note = (this->info).alloc_note;
  mi->wait = (this->info).wait;
  lVar1 = (this->info).end_x;
  mi->repeat_x = (this->info).repeat_x;
  mi->end_x = lVar1;
  for (lVar1 = 0x1b; lVar1 != 0x19b; lVar1 = lVar1 + 0x18) {
    *(undefined2 *)((long)mi->tdata + lVar1 + -0x1b) =
         *(undefined2 *)((long)(this->info).tdata + lVar1 + -0x1b);
    *(undefined1 *)((long)mi->tdata + lVar1 + -0x19) =
         *(undefined1 *)((long)(this->info).tdata + lVar1 + -0x19);
    *(undefined1 *)((long)&((MUSICINFO *)(mi->tdata + -1))->wait + lVar1) =
         *(undefined1 *)((long)&((MUSICINFO *)((this->info).tdata + -1))->wait + lVar1);
  }
  return;
}

Assistant:

void OrgData::GetMusicInfo(MUSICINFO *mi)
{
	mi->dot = info.dot;
	mi->line = info.line;
	mi->alloc_note = info.alloc_note;
	mi->wait = info.wait;
	mi->repeat_x = info.repeat_x;
	mi->end_x = info.end_x;

	for (int i = 0; i < MAXTRACK; i++)
	{
		mi->tdata[i].freq = info.tdata[i].freq;
		mi->tdata[i].wave_no = info.tdata[i].wave_no;
		mi->tdata[i].pipi = info.tdata[i].pipi;
	}
}